

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

BasicHandleInfo * __thiscall
helics::HandleManager::getInterfaceHandle(HandleManager *this,string_view name,InterfaceType type)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
  this_00;
  pointer pvVar2;
  InterfaceType in_CL;
  HandleManager *in_RDI;
  const_iterator fnd;
  BasicHandleInfo *handle;
  MapType *imap;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
  local_38;
  const_reference local_30;
  MapType *local_28;
  InterfaceType local_19;
  
  local_19 = in_CL;
  local_28 = getMap(in_RDI,in_CL);
  local_30 = (const_reference)0x0;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
       ::find((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
               *)in_RDI,(key_type *)0x6349b9);
  this_00._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
       ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
              *)in_RDI);
  bVar1 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
                      *)&stack0xffffffffffffffc0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
                           *)0x6349ee);
    InterfaceHandle::baseValue(&pvVar2->second);
    local_30 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
               operator[]((deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                           *)this_00._M_cur,(size_type)in_RDI);
    if (local_19 == TRANSLATOR) {
      if (local_30->handleType != TRANSLATOR) {
        local_30 = (const_reference)0x0;
      }
    }
    else if ((local_19 == SINK) && (local_30->handleType != SINK)) {
      local_30 = (const_reference)0x0;
    }
  }
  return local_30;
}

Assistant:

const BasicHandleInfo* HandleManager::getInterfaceHandle(std::string_view name,
                                                         InterfaceType type) const
{
    const auto& imap = getMap(type);
    const BasicHandleInfo* handle{nullptr};
    auto fnd = imap.find(name);
    if (fnd != imap.end()) {
        handle = &handles[fnd->second.baseValue()];
        if (type == InterfaceType::TRANSLATOR) {
            if (handle->handleType != InterfaceType::TRANSLATOR) {
                handle = nullptr;
            }
        } else if (type == InterfaceType::SINK) {
            if (handle->handleType != InterfaceType::SINK) {
                handle = nullptr;
            }
        }
    }
    return handle;
}